

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

void __thiscall HEkkDualRow::chooseMakepack(HEkkDualRow *this,HVector *row,HighsInt offset)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  reference pvVar6;
  reference pvVar7;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double value;
  HighsInt index;
  HighsInt i;
  double *rowArray;
  HighsInt *rowIndex;
  HighsInt rowCount;
  int local_2c;
  
  iVar2 = *(int *)(in_RSI + 4);
  piVar4 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x79eab6);
  pdVar5 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x79eac9);
  for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
    iVar3 = piVar4[local_2c];
    dVar1 = pdVar5[iVar3];
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x70),
                        (long)*(int *)(in_RDI + 0x68));
    *pvVar6 = iVar3 + in_EDX;
    iVar3 = *(int *)(in_RDI + 0x68);
    *(int *)(in_RDI + 0x68) = iVar3 + 1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),(long)iVar3);
    *pvVar7 = dVar1;
  }
  return;
}

Assistant:

void HEkkDualRow::chooseMakepack(const HVector* row, const HighsInt offset) {
  /**
   * Pack the indices and values for the row
   *
   * Offset of numCol is used when packing row_ep
   */
  const HighsInt rowCount = row->count;
  const HighsInt* rowIndex = row->index.data();
  const double* rowArray = row->array.data();
  for (HighsInt i = 0; i < rowCount; i++) {
    const HighsInt index = rowIndex[i];
    const double value = rowArray[index];
    packIndex[packCount] = index + offset;
    packValue[packCount++] = value;
  }
}